

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O1

SQInteger __thiscall
SQArray::Next(SQArray *this,SQObjectPtr *refpos,SQObjectPtr *outkey,SQObjectPtr *outval)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  SQObjectType SVar4;
  SQTable *pSVar5;
  undefined1 *puVar6;
  SQObjectPtr *pSVar7;
  SQObjectValue *pSVar8;
  
  pSVar5 = (SQTable *)TranslateIndex(refpos);
  puVar6 = (undefined1 *)0xffffffffffffffff;
  if (pSVar5 < (SQTable *)(this->_values)._size) {
    if (((outkey->super_SQObject)._type & 0x8000000) != 0) {
      pSVar1 = &(((outkey->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(((outkey->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
          super_SQRefCounted._vptr_SQRefCounted[2])();
      }
    }
    (outkey->super_SQObject)._type = OT_INTEGER;
    (outkey->super_SQObject)._unVal.pTable = pSVar5;
    pSVar7 = (this->_values)._vals + (long)pSVar5;
    pSVar8 = &(pSVar7->super_SQObject)._unVal;
    SVar4 = (pSVar7->super_SQObject)._type;
    if (SVar4 == OT_WEAKREF) {
      SVar4 = (pSVar8->pWeakRef->_obj)._type;
      pSVar8 = &(pSVar8->pWeakRef->_obj)._unVal;
    }
    SVar2 = (outval->super_SQObject)._type;
    pSVar3 = (outval->super_SQObject)._unVal.pTable;
    (outval->super_SQObject)._unVal.pWeakRef = (SQWeakRef *)*(SQWeakRef **)pSVar8;
    (outval->super_SQObject)._type = SVar4;
    if ((SVar4 >> 0x1b & 1) != 0) {
      pSVar1 = &(((outval->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    puVar6 = (undefined1 *)
             ((long)&(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                     _vptr_SQRefCounted + 1);
  }
  return (SQInteger)puVar6;
}

Assistant:

SQInteger Next(const SQObjectPtr &refpos,SQObjectPtr &outkey,SQObjectPtr &outval)
    {
        SQUnsignedInteger idx=TranslateIndex(refpos);
        while(idx<_values.size()){
            //first found
            outkey=(SQInteger)idx;
            SQObjectPtr &o = _values[idx];
            outval = _realval(o);
            //return idx for the next iteration
            return ++idx;
        }
        //nothing to iterate anymore
        return -1;
    }